

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
          (DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
           *this,string_view searchValue1,InterfaceHandle *searchValue2,ValueFederate **data,
          InterfaceHandle *data_1,basic_string_view<char,_std::char_traits<char>_> *data_2,
          basic_string_view<char,_std::char_traits<char>_> *data_3)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  args;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  this_00;
  optional<unsigned_long> *this_01;
  mapped_type_conflict *pmVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *in_RDI;
  StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *in_R9;
  optional<unsigned_long> oVar4;
  size_t index;
  iterator fnd2;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff68;
  StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *__t;
  unsigned_long *in_stack_ffffffffffffff70;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  args._M_cur = (__node_type *)
                std::
                unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
                ::find(in_stack_ffffffffffffff68,(key_type *)0x29e960);
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffb8,
                     (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffb0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffa8 =
         std::
         map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
         ::find((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
                 *)in_stack_ffffffffffffff68,(key_type *)0x29e9a5);
    in_stack_ffffffffffffffa0 =
         std::
         map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
         ::end((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff68);
    bVar1 = std::operator==((_Self *)&stack0xffffffffffffffa8,(_Self *)&stack0xffffffffffffffa0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
      uVar3 = extraout_RDX;
      goto LAB_0029ea9e;
    }
  }
  this_01 = (optional<unsigned_long> *)
            StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::size(in_RDI);
  StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::
  emplace_back<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            (in_R9,(ValueFederate **)args._M_cur,(InterfaceHandle *)this_00._M_cur,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa8._M_node,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa0._M_node);
  StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffa0._M_node,in_stack_ffffffffffffff98);
  __t = in_RDI + 1;
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&in_RDI[2].dataptr);
  std::
  unordered_map<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>>
  ::emplace<std::__cxx11::string&,unsigned_long&>
            (in_stack_ffffffffffffff80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             in_stack_ffffffffffffff70);
  pmVar2 = std::
           map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
           ::operator[]((map<helics::InterfaceHandle,_unsigned_long,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_unsigned_long>_>_>
                         *)this_00._M_cur,(key_type *)in_stack_ffffffffffffffa8._M_node);
  *pmVar2 = (mapped_type_conflict)this_01;
  std::optional<unsigned_long>::optional<unsigned_long,_true>(this_01,&__t->csize);
  uVar3 = extraout_RDX_00;
LAB_0029ea9e:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            lookup2[searchValue2] = index;
            return index;
        }